

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall FIX::HttpConnection::processRequest(HttpConnection *this,HttpMessage *request)

{
  int error_00;
  bool bVar1;
  TAG *pTVar2;
  string *psVar3;
  stringstream *in_RCX;
  void *__buf;
  int in_R8D;
  allocator<char> local_1411;
  string local_1410;
  string local_13f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1370;
  undefined1 local_1350 [8];
  string response;
  exception *e;
  BODY body;
  HR hr;
  undefined1 local_f98 [8];
  A a_1;
  string local_dd8;
  undefined1 local_db8 [8];
  A a;
  CENTER center_1;
  H1 h1;
  TITLE title;
  CENTER center;
  HEAD head;
  undefined1 local_360 [8];
  string titleString;
  stringstream local_330 [8];
  stringstream b;
  ostream local_320 [376];
  stringstream local_1a8 [8];
  stringstream h;
  ostream local_198 [380];
  int local_1c;
  HttpMessage *pHStack_18;
  int error;
  HttpMessage *request_local;
  HttpConnection *this_local;
  
  local_1c = 200;
  pHStack_18 = request;
  request_local = (HttpMessage *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_360,"QuickFIX Engine Web Interface",
             (allocator<char> *)((long)&head.super_TAG.m_stream + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&head.super_TAG.m_stream + 7));
  HTML::HEAD::HEAD((HEAD *)&center.super_TAG.m_stream,local_198);
  HTML::TAG::text((TAG *)&center.super_TAG.m_stream);
  HTML::CENTER::CENTER((CENTER *)&title.super_TAG.m_stream,local_198);
  HTML::TAG::text((TAG *)&title.super_TAG.m_stream);
  HTML::TITLE::TITLE((TITLE *)&h1.super_TAG.m_stream,local_198);
  HTML::TAG::text<std::__cxx11::string>
            ((TAG *)&h1.super_TAG.m_stream,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360);
  HTML::TITLE::~TITLE((TITLE *)&h1.super_TAG.m_stream);
  HTML::H1::H1((H1 *)&center_1.super_TAG.m_stream,local_198);
  HTML::TAG::text<std::__cxx11::string>
            ((TAG *)&center_1.super_TAG.m_stream,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360);
  HTML::H1::~H1((H1 *)&center_1.super_TAG.m_stream);
  HTML::CENTER::~CENTER((CENTER *)&title.super_TAG.m_stream);
  HTML::CENTER::CENTER((CENTER *)&a.super_TAG.m_stream,local_198);
  HTML::TAG::text((TAG *)&a.super_TAG.m_stream);
  HTML::A::A((A *)local_db8,local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dd8,"/",(allocator<char> *)((long)&a_1.super_TAG.m_stream + 7));
  pTVar2 = &HTML::A::href((A *)local_db8,&local_dd8)->super_TAG;
  HTML::TAG::text<char[5]>(pTVar2,(char (*) [5])"HOME");
  std::__cxx11::string::~string((string *)&local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a_1.super_TAG.m_stream + 7));
  HTML::A::~A((A *)local_db8);
  std::operator<<(local_198,HTML::NBSP);
  HTML::A::A((A *)local_f98,local_198);
  HttpMessage::toString_abi_cxx11_((string *)&hr.super_TAG.m_stream,pHStack_18);
  pTVar2 = &HTML::A::href((A *)local_f98,(string *)&hr.super_TAG.m_stream)->super_TAG;
  HTML::TAG::text<char[7]>(pTVar2,(char (*) [7])"RELOAD");
  std::__cxx11::string::~string((string *)&hr.super_TAG.m_stream);
  HTML::A::~A((A *)local_f98);
  HTML::CENTER::~CENTER((CENTER *)&a.super_TAG.m_stream);
  HTML::HR::HR((HR *)&body.super_TAG.m_stream,local_198);
  HTML::TAG::text((TAG *)&body.super_TAG.m_stream);
  HTML::HR::~HR((HR *)&body.super_TAG.m_stream);
  HTML::HEAD::~HEAD((HEAD *)&center.super_TAG.m_stream);
  HTML::BODY::BODY((BODY *)&e,local_320);
  HTML::TAG::text((TAG *)&e);
  psVar3 = HttpMessage::getRootString_abi_cxx11_(pHStack_18);
  bVar1 = std::operator==(psVar3,"/");
  if (bVar1) {
    in_RCX = (stringstream *)local_330;
    processRoot(this,pHStack_18,(stringstream *)local_1a8,in_RCX);
  }
  else {
    psVar3 = HttpMessage::getRootString_abi_cxx11_(pHStack_18);
    bVar1 = std::operator==(psVar3,"/resetSessions");
    if (bVar1) {
      in_RCX = (stringstream *)local_330;
      processResetSessions(this,pHStack_18,(stringstream *)local_1a8,in_RCX);
    }
    else {
      psVar3 = HttpMessage::getRootString_abi_cxx11_(pHStack_18);
      bVar1 = std::operator==(psVar3,"/refreshSessions");
      if (bVar1) {
        in_RCX = (stringstream *)local_330;
        processRefreshSessions(this,pHStack_18,(stringstream *)local_1a8,in_RCX);
      }
      else {
        psVar3 = HttpMessage::getRootString_abi_cxx11_(pHStack_18);
        bVar1 = std::operator==(psVar3,"/enableSessions");
        if (bVar1) {
          in_RCX = (stringstream *)local_330;
          processEnableSessions(this,pHStack_18,(stringstream *)local_1a8,in_RCX);
        }
        else {
          psVar3 = HttpMessage::getRootString_abi_cxx11_(pHStack_18);
          bVar1 = std::operator==(psVar3,"/disableSessions");
          if (bVar1) {
            in_RCX = (stringstream *)local_330;
            processDisableSessions(this,pHStack_18,(stringstream *)local_1a8,in_RCX);
          }
          else {
            psVar3 = HttpMessage::getRootString_abi_cxx11_(pHStack_18);
            bVar1 = std::operator==(psVar3,"/session");
            if (bVar1) {
              in_RCX = (stringstream *)local_330;
              processSession(this,pHStack_18,(stringstream *)local_1a8,in_RCX);
            }
            else {
              psVar3 = HttpMessage::getRootString_abi_cxx11_(pHStack_18);
              bVar1 = std::operator==(psVar3,"/resetSession");
              if (bVar1) {
                in_RCX = (stringstream *)local_330;
                processResetSession(this,pHStack_18,(stringstream *)local_1a8,in_RCX);
              }
              else {
                psVar3 = HttpMessage::getRootString_abi_cxx11_(pHStack_18);
                bVar1 = std::operator==(psVar3,"/refreshSession");
                if (bVar1) {
                  in_RCX = (stringstream *)local_330;
                  processRefreshSession(this,pHStack_18,(stringstream *)local_1a8,in_RCX);
                }
                else {
                  local_1c = 0x194;
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::stringstream::str();
  std::operator+(&local_1390,"<HTML>",&local_13b0);
  std::__cxx11::stringstream::str();
  std::operator+(&local_1370,&local_1390,&local_13d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1350,
                 &local_1370,"</HTML>");
  std::__cxx11::string::~string((string *)&local_1370);
  std::__cxx11::string::~string((string *)&local_13d0);
  std::__cxx11::string::~string((string *)&local_1390);
  std::__cxx11::string::~string((string *)&local_13b0);
  error_00 = local_1c;
  bVar1 = local_1c != 200;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1410,"",&local_1411);
  }
  else {
    std::__cxx11::string::string((string *)&local_1410,(string *)local_1350);
  }
  HttpMessage::createResponse(&local_13f0,error_00,&local_1410);
  send(this,(int)&local_13f0,__buf,(size_t)in_RCX,in_R8D);
  std::__cxx11::string::~string((string *)&local_13f0);
  std::__cxx11::string::~string((string *)&local_1410);
  if (bVar1) {
    std::allocator<char>::~allocator(&local_1411);
  }
  disconnect(this,0);
  std::__cxx11::string::~string((string *)local_1350);
  HTML::BODY::~BODY((BODY *)&e);
  std::__cxx11::string::~string((string *)local_360);
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void HttpConnection::processRequest(const HttpMessage &request) {
  int error = 200;
  std::stringstream h;
  std::stringstream b;
  std::string titleString = "QuickFIX Engine Web Interface";

  {
    HEAD head(h);
    head.text();
    {
      CENTER center(h);
      center.text();
      {
        TITLE title(h);
        title.text(titleString);
      }
      {
        H1 h1(h);
        h1.text(titleString);
      }
    }
    {
      CENTER center(h);
      center.text();
      {
        A a(h);
        a.href("/").text("HOME");
      }
      h << NBSP;
      {
        A a(h);
        a.href(request.toString()).text("RELOAD");
      }
    }
    HR hr(h);
    hr.text();
  }

  BODY body(b);
  body.text();

  try {
    if (request.getRootString() == "/") {
      processRoot(request, h, b);
    } else if (request.getRootString() == "/resetSessions") {
      processResetSessions(request, h, b);
    } else if (request.getRootString() == "/refreshSessions") {
      processRefreshSessions(request, h, b);
    } else if (request.getRootString() == "/enableSessions") {
      processEnableSessions(request, h, b);
    } else if (request.getRootString() == "/disableSessions") {
      processDisableSessions(request, h, b);
    } else if (request.getRootString() == "/session") {
      processSession(request, h, b);
    } else if (request.getRootString() == "/resetSession") {
      processResetSession(request, h, b);
    } else if (request.getRootString() == "/refreshSession") {
      processRefreshSession(request, h, b);
    } else {
      error = 404;
    }
  } catch (std::exception &e) {
    error = 400;
    b << e.what();
  }

  std::string response = "<HTML>" + h.str() + b.str() + "</HTML>";
  send(HttpMessage::createResponse(error, error == 200 ? response : ""));

  disconnect();
}